

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetIdToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  TokenType token_type;
  
  pbVar1 = (byte *)this->buffer_end_;
  pbVar3 = (byte *)this->cursor_;
  if (pbVar3 < pbVar1) {
    pbVar3 = pbVar3 + 1;
    this->cursor_ = (char *)pbVar3;
  }
  token_type = Reserved;
  if (pbVar3 < pbVar1) {
    iVar2 = (int)pbVar3;
    iVar4 = 0;
    do {
      iVar5 = iVar4;
      if ((""[(ulong)*pbVar3 + 1] & 1U) == 0) break;
      pbVar3 = pbVar3 + 1;
      this->cursor_ = (char *)pbVar3;
      iVar4 = iVar4 + 1;
      iVar5 = (int)pbVar1 - iVar2;
    } while (pbVar3 != pbVar1);
    token_type = (uint)(iVar5 != 0) * 2 + Reserved;
  }
  TextToken(__return_storage_ptr__,this,token_type,0);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetIdToken() {
  ReadChar();
  if (NoTrailingReservedChars()) {
    return TextToken(TokenType::Reserved);
  }
  return TextToken(TokenType::Var);
}